

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
baryonyx::details::pi_file_observer::make_observation<double>
          (pi_file_observer *this,sparse_matrix<int> *param_1,double *param_2,double *pi)

{
  int iVar1;
  int i;
  ulong uVar2;
  undefined8 uStack_38;
  
  uStack_38 = *(long *)(*(long *)&this->m_ofs + -0x18);
  if (((&this->field_0x28)[uStack_38] & 5) != 0) {
    return;
  }
  iVar1 = this->m_len;
  std::ostream::_M_insert<double>(*pi);
  if ((1 < iVar1) && (this->constraints != 1)) {
    uVar2 = 1;
    do {
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->m_ofs,(char *)((long)&uStack_38 + 6),1);
      std::ostream::_M_insert<double>(pi[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)this->constraints);
  }
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->m_ofs,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        if (m_ofs) {
            if (m_len > 1) {
                m_ofs << pi[0];

                for (int i = 1; i != constraints; ++i)
                    m_ofs << ' ' << pi[i];

            } else {
                m_ofs << pi[0];
            }

            m_ofs << '\n';
        }
    }